

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O0

ComparatorDisposer *
ApprovalTests::FileApprover::registerComparatorForExtension
          (string *extensionWithDot,shared_ptr<ApprovalTests::ApprovalComparator> *comparator)

{
  shared_ptr<ApprovalTests::ApprovalComparator> *in_RDX;
  ComparatorDisposer *in_RDI;
  shared_ptr<ApprovalTests::ApprovalComparator> *unaff_retaddr;
  string *in_stack_00000008;
  shared_ptr<ApprovalTests::ApprovalComparator> *in_stack_ffffffffffffff98;
  
  ::std::shared_ptr<ApprovalTests::ApprovalComparator>::shared_ptr(in_RDX,in_stack_ffffffffffffff98)
  ;
  ComparatorFactory::registerComparator(in_stack_00000008,unaff_retaddr);
  ::std::shared_ptr<ApprovalTests::ApprovalComparator>::~shared_ptr
            ((shared_ptr<ApprovalTests::ApprovalComparator> *)0x13b3d6);
  return in_RDI;
}

Assistant:

ComparatorDisposer FileApprover::registerComparatorForExtension(
        const std::string& extensionWithDot,
        std::shared_ptr<ApprovalComparator> comparator)
    {
        return ComparatorFactory::registerComparator(extensionWithDot, comparator);
    }